

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_gif_main(stbi__context *s,int **delays,int *x,int *y,int *z,int *comp,int req_comp
                          )

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  stbi_uc *in_RDI;
  uint *in_R8;
  void *tmp;
  int in_stack_00000008;
  int stride;
  stbi__gif g;
  stbi_uc *two_back;
  stbi_uc *out;
  stbi_uc *u;
  int layers;
  undefined4 in_stack_ffffffffffff7730;
  undefined4 in_stack_ffffffffffff7734;
  int local_88c8;
  int local_88c4;
  void *local_88c0;
  uint in_stack_ffffffffffff7748;
  uint in_stack_ffffffffffff774c;
  int in_stack_ffffffffffff7750;
  int in_stack_ffffffffffff7754;
  uchar *in_stack_ffffffffffff7758;
  stbi_uc *in_stack_ffffffffffff7778;
  int in_stack_ffffffffffff7784;
  int *in_stack_ffffffffffff7788;
  stbi__gif *in_stack_ffffffffffff7790;
  stbi__context *in_stack_ffffffffffff7798;
  undefined4 local_60;
  uchar *local_50;
  stbi_uc *local_48;
  uint local_3c;
  uchar *local_8;
  
  iVar1 = stbi__gif_test((stbi__context *)
                         CONCAT44(in_stack_ffffffffffff7734,in_stack_ffffffffffff7730));
  if (iVar1 == 0) {
    stbi__err("not GIF");
    local_8 = (uchar *)0x0;
  }
  else {
    local_3c = 0;
    local_50 = (uchar *)0x0;
    memset(&local_88c8,0,0x8870);
    if (in_RSI != (long *)0x0) {
      *in_RSI = 0;
    }
    do {
      local_48 = stbi__gif_load_next(in_stack_ffffffffffff7798,in_stack_ffffffffffff7790,
                                     in_stack_ffffffffffff7788,in_stack_ffffffffffff7784,
                                     in_stack_ffffffffffff7778);
      if (local_48 == in_RDI) {
        local_48 = (stbi_uc *)0x0;
      }
      uVar2 = local_3c;
      if (local_48 != (stbi_uc *)0x0) {
        *in_RDX = local_88c8;
        *in_RCX = local_88c4;
        uVar2 = local_3c + 1;
        iVar1 = local_88c8 * local_88c4 * 4;
        if (local_50 == (uchar *)0x0) {
          local_50 = (uchar *)stbi__malloc(0x17eceb);
          if (in_RSI != (long *)0x0) {
            pvVar3 = stbi__malloc(0x17ed0f);
            *in_RSI = (long)pvVar3;
          }
        }
        else {
          local_50 = (uchar *)realloc(local_50,(long)(int)(uVar2 * iVar1));
          if (local_50 == (uchar *)0x0) {
            free(local_88c0);
            free((void *)CONCAT44(in_stack_ffffffffffff7754,in_stack_ffffffffffff7750));
            free((void *)CONCAT44(in_stack_ffffffffffff774c,in_stack_ffffffffffff7748));
            stbi__err("outofmem");
            return (void *)0x0;
          }
          if (in_RSI != (long *)0x0) {
            pvVar3 = realloc((void *)*in_RSI,(long)(int)uVar2 << 2);
            *in_RSI = (long)pvVar3;
          }
        }
        memcpy(local_50 + (int)(local_3c * iVar1),local_48,(long)iVar1);
        if (in_RSI != (long *)0x0) {
          *(undefined4 *)(*in_RSI + (ulong)local_3c * 4) = local_60;
        }
      }
      local_3c = uVar2;
    } while (local_48 != (stbi_uc *)0x0);
    free(local_88c0);
    free((void *)CONCAT44(in_stack_ffffffffffff7754,in_stack_ffffffffffff7750));
    free((void *)CONCAT44(in_stack_ffffffffffff774c,in_stack_ffffffffffff7748));
    if ((in_stack_00000008 != 0) && (in_stack_00000008 != 4)) {
      local_50 = stbi__convert_format
                           (in_stack_ffffffffffff7758,in_stack_ffffffffffff7754,
                            in_stack_ffffffffffff7750,in_stack_ffffffffffff774c,
                            in_stack_ffffffffffff7748);
    }
    *in_R8 = local_3c;
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

static void *stbi__load_gif_main(stbi__context *s, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   if (stbi__gif_test(s)) {
      int layers = 0;
      stbi_uc *u = 0;
      stbi_uc *out = 0;
      stbi_uc *two_back = 0;
      stbi__gif g;
      int stride;
      memset(&g, 0, sizeof(g));
      if (delays) {
         *delays = 0;
      }

      do {
         u = stbi__gif_load_next(s, &g, comp, req_comp, two_back);
         if (u == (stbi_uc *) s) u = 0;  // end of animated gif marker

         if (u) {
            *x = g.w;
            *y = g.h;
            ++layers;
            stride = g.w * g.h * 4;

            if (out) {
               void *tmp = (stbi_uc*) STBI_REALLOC( out, layers * stride );
               if (NULL == tmp) {
                  STBI_FREE(g.out);
                  STBI_FREE(g.history);
                  STBI_FREE(g.background);
                  return stbi__errpuc("outofmem", "Out of memory");
               }
               else
                  out = (stbi_uc*) tmp;
               if (delays) {
                  *delays = (int*) STBI_REALLOC( *delays, sizeof(int) * layers );
               }
            } else {
               out = (stbi_uc*)stbi__malloc( layers * stride );
               if (delays) {
                  *delays = (int*) stbi__malloc( layers * sizeof(int) );
               }
            }
            memcpy( out + ((layers - 1) * stride), u, stride );
            if (layers >= 2) {
               two_back = out - 2 * stride;
            }

            if (delays) {
               (*delays)[layers - 1U] = g.delay;
            }
         }
      } while (u != 0);

      // free temp buffer;
      STBI_FREE(g.out);
      STBI_FREE(g.history);
      STBI_FREE(g.background);

      // do the final conversion after loading everything;
      if (req_comp && req_comp != 4)
         out = stbi__convert_format(out, 4, req_comp, layers * g.w, g.h);

      *z = layers;
      return out;
   } else {
      return stbi__errpuc("not GIF", "Image was not as a gif type.");
   }
}